

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::init
          (PrimitiveSetInvarianceCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  pointer *ppPVar2;
  ostringstream *this_00;
  WindingUsage WVar3;
  Winding WVar4;
  RenderContext *renderCtx;
  pointer pPVar5;
  pointer pPVar6;
  SharedPtrStateBase *pSVar7;
  TestLog *log;
  pointer pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  PrimitiveSetInvarianceCase *pPVar11;
  pointer pWVar12;
  uint uVar13;
  uint extraout_EAX;
  RenderTarget *renderTarget;
  long *plVar14;
  ShaderProgram *this_01;
  ulong uVar15;
  pointer pPVar16;
  TestError *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ContextInfo *pCVar18;
  size_type *psVar19;
  ulong *puVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  Context *pCVar22;
  char *extraout_RDX;
  char *pcVar23;
  long lVar24;
  undefined1 in_R9B;
  size_type *psVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  windings;
  string fragmentShaderTemplate;
  ScopedLogSection section;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string floatLit01;
  string vertexShaderTemplate;
  undefined1 local_420 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  size_type *local_3d0;
  value_type local_3c8;
  Winding local_3a8;
  ShaderProgram *local_3a0;
  SharedPtrStateBase *local_398;
  size_type *local_390;
  value_type local_388;
  ShaderProgram *local_368;
  SharedPtrStateBase *pSStack_360;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  local_358;
  PrimitiveSetInvarianceCase *local_338;
  char *local_330;
  undefined1 local_328 [32];
  ulong local_308;
  int local_300;
  float local_2fc;
  ulong local_2f8;
  string local_2f0;
  Context *local_2d0;
  long local_2c8;
  Context local_2c0;
  long local_2a8;
  undefined1 local_2a0 [16];
  ContextInfo *local_290;
  pointer local_288;
  undefined1 local_280 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Base_ptr local_250 [2];
  TestContext *local_240 [2];
  undefined1 local_230 [32];
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_140 [8];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  deUint32 local_108;
  undefined1 local_100 [208];
  
  local_358.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WVar3 = this->m_windingUsage;
  if (WVar3 == WINDINGUSAGE_VARY) {
    local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_358,(value_type *)local_1b0);
    local_1b0._0_4_ = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_358,(value_type *)local_1b0);
  }
  else if (WVar3 == WINDINGUSAGE_CW) {
    local_1b0._0_4_ = 1;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_358,(value_type *)local_1b0);
  }
  else if (WVar3 == WINDINGUSAGE_CCW) {
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
    ::push_back(&local_358,(value_type *)local_1b0);
  }
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  local_308 = 0;
  pcVar23 = extraout_RDX;
  local_338 = this;
  do {
    if (0 < (int)((ulong)((long)local_358.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_358.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
      local_2fc = 10.0 / (float)(int)((uint)local_308 | 10);
      local_300 = (uint)local_308 + 1;
      local_330 = (char *)0x0;
      do {
        pWVar12 = local_358.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar25 = &local_3c8._M_string_length;
        de::floatToString_abi_cxx11_((string *)(local_280 + 0x10),(de *)0x2,local_2fc,(int)pcVar23);
        local_2f8 = (long)(this->m_programs).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_programs).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        local_250[0] = (_Base_ptr)local_240;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_250,
                   "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                   ,"");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((ostringstream *)local_1b0,local_300);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x96f80f);
        local_420._0_8_ = &local_410;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar17) {
          local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_410._8_8_ = plVar14[3];
        }
        else {
          local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_420._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_420._8_8_ = plVar14[1];
        *plVar14 = (long)paVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_420);
        local_2c0.m_contextInfo = (ContextInfo *)local_2a0;
        pCVar18 = (ContextInfo *)(plVar14 + 2);
        if ((ContextInfo *)*plVar14 == pCVar18) {
          local_2a0._0_8_ = pCVar18->_vptr_ContextInfo;
          local_2a0._8_8_ = plVar14[3];
        }
        else {
          local_2a0._0_8_ = pCVar18->_vptr_ContextInfo;
          local_2c0.m_contextInfo = (ContextInfo *)*plVar14;
        }
        local_2a8 = plVar14[1];
        *plVar14 = (long)pCVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._0_8_ != &local_410) {
          operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
        }
        if (local_3d0 != psVar25) {
          operator_delete(local_3d0,local_3c8._M_string_length + 1);
        }
        (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                  ((string *)local_328,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
                   this->m_spacing,pWVar12[(long)local_330],(uint)this->m_usePointMode,(bool)in_R9B)
        ;
        plVar14 = (long *)std::__cxx11::string::replace((ulong)local_328,0,(char *)0x0,0x96eea1);
        psVar19 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar19) {
          local_388._M_string_length = *psVar19;
          local_388.field_2._M_allocated_capacity = plVar14[3];
          local_390 = &local_388._M_string_length;
        }
        else {
          local_388._M_string_length = *psVar19;
          local_390 = (size_type *)*plVar14;
        }
        local_388._M_dataplus._M_p = (pointer)plVar14[1];
        *plVar14 = (long)psVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_390);
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar17) {
          local_3e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_3e8._8_8_ = plVar14[3];
          local_3f8._0_8_ = &local_3e8;
        }
        else {
          local_3e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_3f8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_3f8._8_8_ = plVar14[1];
        *plVar14 = (long)paVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append(local_3f8,local_280._16_8_);
        puVar20 = (ulong *)(plVar14 + 2);
        if ((size_type *)*plVar14 == puVar20) {
          local_3c8._M_string_length = *puVar20;
          local_3c8.field_2._M_allocated_capacity = plVar14[3];
          local_3d0 = psVar25;
        }
        else {
          local_3c8._M_string_length = *puVar20;
          local_3d0 = (size_type *)*plVar14;
        }
        local_3c8._M_dataplus._M_p = (pointer)plVar14[1];
        *plVar14 = (long)puVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_3d0);
        local_420._0_8_ = &local_410;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar17) {
          local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_410._8_8_ = plVar14[3];
        }
        else {
          local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_420._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_420._8_8_ = plVar14[1];
        *plVar14 = (long)paVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append(local_420,local_280._16_8_);
        pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar14 + 2)
        ;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar14 == pbVar21
           ) {
          local_1a0[0]._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
          local_1a0[0]._M_string_length = plVar14[3];
          local_1b0._0_8_ = local_1a0;
        }
        else {
          local_1a0[0]._M_dataplus._M_p = (pbVar21->_M_dataplus)._M_p;
          local_1b0._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar14;
        }
        local_1b0._8_8_ = plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_1b0);
        local_2d0 = &local_2c0;
        pCVar22 = (Context *)(plVar14 + 2);
        if ((Context *)*plVar14 == pCVar22) {
          local_2c0.m_testCtx = pCVar22->m_testCtx;
          local_2c0.m_renderCtx = (RenderContext *)plVar14[3];
        }
        else {
          local_2c0.m_testCtx = pCVar22->m_testCtx;
          local_2d0 = (Context *)*plVar14;
        }
        local_2c8 = plVar14[1];
        *plVar14 = (long)pCVar22;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._0_8_ !=
            local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_dataplus._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._0_8_ != &local_410) {
          operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
        }
        if (local_3d0 != psVar25) {
          operator_delete(local_3d0,local_3c8._M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._0_8_ != &local_3e8) {
          operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
        }
        if (local_390 != &local_388._M_string_length) {
          operator_delete(local_390,local_388._M_string_length + 1);
        }
        if ((Context *)local_328._0_8_ != (Context *)(local_328 + 0x10)) {
          operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
        }
        local_328._0_8_ = local_328 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,
                   "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                   ,"");
        WVar4 = local_358.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)local_330];
        pcVar23 = local_330;
        this_01 = (ShaderProgram *)operator_new(0xd0);
        pCVar22 = (this->super_TestCase).m_context;
        renderCtx = pCVar22->m_renderCtx;
        local_100[0x10] = 0;
        local_100._17_8_ = 0;
        local_100._0_8_ = (pointer)0x0;
        local_100[8] = 0;
        local_100._9_7_ = 0;
        memset(local_1b0,0,0xac);
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)pCVar22,(Context *)local_250[0],pcVar23);
        local_420._0_8_ = local_420._0_8_ & 0xffffffff00000000;
        local_420._8_8_ = local_410._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_420 + 8),local_2f0._M_dataplus._M_p,
                   local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + (local_420._0_8_ & 0xffffffff) * 0x18),
                    (value_type *)(local_420 + 8));
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_1d0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                   (Context *)local_2c0.m_contextInfo,pcVar23);
        local_3d0 = (size_type *)CONCAT44(local_3d0._4_4_,3);
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c8,local_1d0._M_dataplus._M_p,
                   local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + ((ulong)local_3d0 & 0xffffffff) * 0x18),&local_3c8);
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_1f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_2d0,
                   pcVar23);
        local_3f8._0_4_ = 4;
        local_3f8._8_8_ = local_3e8._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_3f8 + 8),local_1f0._M_dataplus._M_p,
                   local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + (local_3f8._0_8_ & 0xffffffff) * 0x18),
                    (value_type *)(local_3f8 + 8));
        (anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_210,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                   (Context *)local_328._0_8_,pcVar23);
        local_390 = (size_type *)CONCAT44(local_390._4_4_,1);
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_388,local_210._M_dataplus._M_p,
                   local_210._M_dataplus._M_p + local_210._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + ((ulong)local_390 & 0xffffffff) * 0x18),&local_388);
        local_290 = (ContextInfo *)local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"out_te_tessCoord","");
        local_230._0_8_ = local_230 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,local_290,
                   (undefined1 *)((long)&(local_288->_M_dataplus)._M_p + (long)local_290));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_100,(value_type *)local_230);
        local_108 = 0x8c8c;
        glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_1b0);
        pSStack_360 = (SharedPtrStateBase *)0x0;
        local_368 = this_01;
        local_398 = (SharedPtrStateBase *)operator_new(0x20);
        local_398->strongRefCount = 0;
        local_398->weakRefCount = 0;
        local_398->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b47b90;
        local_398[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
        local_398->strongRefCount = 1;
        local_398->weakRefCount = 1;
        LOCK();
        local_398->strongRefCount = local_398->strongRefCount + 1;
        UNLOCK();
        LOCK();
        local_398->weakRefCount = local_398->weakRefCount + 1;
        UNLOCK();
        pPVar5 = (this->m_programs).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_3a8 = WVar4;
        local_3a0 = this_01;
        pSStack_360 = local_398;
        if (pPVar5 == (this->m_programs).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pPVar6 = (this->m_programs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((long)pPVar5 - (long)pPVar6 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar24 = (long)pPVar5 - (long)pPVar6 >> 3;
          uVar26 = lVar24 * -0x5555555555555555;
          uVar15 = uVar26;
          if (pPVar5 == pPVar6) {
            uVar15 = 1;
          }
          uVar28 = uVar15 + uVar26;
          if (0x555555555555554 < uVar28) {
            uVar28 = 0x555555555555555;
          }
          if (CARRY8(uVar15,uVar26)) {
            uVar28 = 0x555555555555555;
          }
          if (uVar28 == 0) {
            pPVar16 = (pointer)0x0;
          }
          else {
            pPVar16 = (pointer)operator_new(uVar28 * 0x18);
          }
          (&pPVar16->winding)[lVar24 * 2] = local_3a8;
          (&(pPVar16->program).m_ptr)[lVar24] = local_3a0;
          (&(pPVar16->program).m_state)[lVar24] = local_398;
          pPVar8 = pPVar6;
          pPVar9 = pPVar16;
          if (local_398 != (SharedPtrStateBase *)0x0) {
            LOCK();
            local_398->strongRefCount = local_398->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar1 = &(&(pPVar16->program).m_state)[lVar24]->weakRefCount;
            *pdVar1 = *pdVar1 + 1;
            UNLOCK();
          }
          for (; pPVar10 = pPVar6, pPVar11 = local_338, pPVar5 != pPVar8; pPVar8 = pPVar8 + 1) {
            pPVar9->winding = pPVar8->winding;
            (pPVar9->program).m_ptr = (pPVar8->program).m_ptr;
            pSVar7 = (pPVar8->program).m_state;
            (pPVar9->program).m_state = pSVar7;
            if (pSVar7 != (SharedPtrStateBase *)0x0) {
              LOCK();
              pSVar7->strongRefCount = pSVar7->strongRefCount + 1;
              UNLOCK();
              LOCK();
              pdVar1 = &((pPVar9->program).m_state)->weakRefCount;
              *pdVar1 = *pdVar1 + 1;
              UNLOCK();
            }
            pPVar9 = pPVar9 + 1;
          }
          for (; local_338 = pPVar11, pPVar5 != pPVar10; pPVar10 = pPVar10 + 1) {
            pSVar7 = (pPVar10->program).m_state;
            if (pSVar7 != (SharedPtrStateBase *)0x0) {
              LOCK();
              pdVar1 = &pSVar7->strongRefCount;
              *pdVar1 = *pdVar1 + -1;
              UNLOCK();
              if (*pdVar1 == 0) {
                (pPVar10->program).m_ptr = (ShaderProgram *)0x0;
                (*((pPVar10->program).m_state)->_vptr_SharedPtrStateBase[2])();
              }
              LOCK();
              pdVar1 = &((pPVar10->program).m_state)->weakRefCount;
              *pdVar1 = *pdVar1 + -1;
              UNLOCK();
              if (*pdVar1 == 0) {
                pSVar7 = (pPVar10->program).m_state;
                if (pSVar7 != (SharedPtrStateBase *)0x0) {
                  (*pSVar7->_vptr_SharedPtrStateBase[1])();
                }
                (pPVar10->program).m_state = (SharedPtrStateBase *)0x0;
              }
            }
            pPVar11 = local_338;
          }
          if (pPVar6 != (pointer)0x0) {
            operator_delete(pPVar6,(long)(pPVar11->m_programs).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pPVar6);
          }
          (pPVar11->m_programs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
          ._M_impl.super__Vector_impl_data._M_start = pPVar16;
          (pPVar11->m_programs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar9 + 1;
          (pPVar11->m_programs).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar16 + uVar28;
        }
        else {
          pPVar5->winding = WVar4;
          (pPVar5->program).m_ptr = this_01;
          (pPVar5->program).m_state = local_398;
          if (local_398 != (SharedPtrStateBase *)0x0) {
            LOCK();
            local_398->strongRefCount = local_398->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar1 = &((pPVar5->program).m_state)->weakRefCount;
            *pdVar1 = *pdVar1 + 1;
            UNLOCK();
          }
          ppPVar2 = &(this->m_programs).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar2 = *ppPVar2 + 1;
        }
        uVar15 = local_2f8;
        psVar25 = &local_3c8._M_string_length;
        if (local_398 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &local_398->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_3a0 = (ShaderProgram *)0x0;
            (*local_398->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &local_398->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_398 != (SharedPtrStateBase *)0x0) {
              (*local_398->_vptr_SharedPtrStateBase[1])();
            }
            local_398 = (SharedPtrStateBase *)0x0;
          }
        }
        if (pSStack_360 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &pSStack_360->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_368 = (ShaderProgram *)0x0;
            (*pSStack_360->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &pSStack_360->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (pSStack_360 != (SharedPtrStateBase *)0x0) {
              (*pSStack_360->_vptr_SharedPtrStateBase[1])();
            }
            pSStack_360 = (SharedPtrStateBase *)0x0;
          }
        }
        if ((ContextInfo *)local_230._0_8_ != (ContextInfo *)(local_230 + 0x10)) {
          operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
        }
        if (local_290 != (ContextInfo *)local_280) {
          operator_delete(local_290,(ulong)((long)&((_Alloc_hider *)local_280._0_8_)->_M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_3f8._8_8_ != local_3e8._M_local_buf + 8) {
          operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((char *)local_420._8_8_ != local_410._M_local_buf + 8) {
          operator_delete((void *)local_420._8_8_,local_410._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        iVar27 = (int)(uVar15 >> 3) * -0x55555555;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&local_120);
        lVar24 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b0 + lVar24));
          this = local_338;
          lVar24 = lVar24 + -0x18;
        } while (lVar24 != -0x18);
        log = ((local_338->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((ostringstream *)local_1b0,iVar27);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x98c62f);
        local_420._0_8_ = &local_410;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar17) {
          local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_410._8_8_ = plVar14[3];
        }
        else {
          local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_420._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_420._8_8_ = plVar14[1];
        *plVar14 = (long)paVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        std::ostream::operator<<((ostringstream *)local_1b0,iVar27);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0x973b9c);
        local_3f8._0_8_ = &local_3e8;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar17) {
          local_3e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_3e8._8_8_ = plVar14[3];
        }
        else {
          local_3e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_3f8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar14;
        }
        local_3f8._8_8_ = plVar14[1];
        *plVar14 = (long)paVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)&local_2f0,log,(string *)local_420,(string *)local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._0_8_ != &local_3e8) {
          operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
        }
        if (local_390 != &local_388._M_string_length) {
          operator_delete(local_390,local_388._M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._0_8_ != &local_410) {
          operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
        }
        if (local_3d0 != psVar25) {
          operator_delete(local_3d0,local_3c8._M_string_length + 1);
        }
        if ((iVar27 == 0) ||
           ((((this->m_programs).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr)->m_program).m_info.
            linkOk == false)) {
          glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                          (this->m_programs).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr);
        }
        if ((((this->m_programs).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::Program>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr)->m_program).m_info.
            linkOk == false) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,"Program compilation failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                     ,0xe80);
          __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (0 < iVar27) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          this_00 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Note: program ",0xe);
          std::ostream::operator<<(this_00,iVar27);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,
                     " is similar to above, except some constants are different, and: ",0x40);
          local_3c8._M_dataplus._M_p = (pointer)0x0;
          local_3c8._M_string_length = local_3c8._M_string_length & 0xffffffffffffff00;
          local_3d0 = psVar25;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_3d0);
          local_420._0_8_ = &local_410;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 == paVar17) {
            local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_410._8_8_ = plVar14[3];
          }
          else {
            local_410._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_420._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar14;
          }
          local_420._8_8_ = plVar14[1];
          *plVar14 = (long)paVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append(local_420);
          this = local_338;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 == paVar17) {
            local_3e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3e8._8_8_ = plVar14[3];
            local_3f8._0_8_ = &local_3e8;
          }
          else {
            local_3e8._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_3f8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar14;
          }
          local_3f8._8_8_ = plVar14[1];
          *plVar14 = (long)paVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420._0_8_ != &local_410) {
            operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
          }
          if (local_3d0 != psVar25) {
            operator_delete(local_3d0,local_3c8._M_string_length + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),(char *)local_3f8._0_8_,local_3f8._8_8_);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._0_8_ != &local_3e8) {
            operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base(local_138);
        }
        tcu::TestLog::endSection((TestLog *)local_2f0._M_dataplus._M_p);
        if ((Context *)local_328._0_8_ != (Context *)(local_328 + 0x10)) {
          operator_delete((void *)local_328._0_8_,local_328._16_8_ + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,(ulong)((long)&(local_2c0.m_testCtx)->m_platform + 1));
        }
        if (local_2c0.m_contextInfo != (ContextInfo *)local_2a0) {
          operator_delete(local_2c0.m_contextInfo,(ulong)((long)(Platform **)local_2a0._0_8_ + 1));
        }
        if (local_250[0] != (_Base_ptr)local_240) {
          operator_delete(local_250[0],(ulong)((long)&local_240[0]->m_platform + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._16_8_ != &local_260) {
          operator_delete((void *)local_280._16_8_,(ulong)(local_260._M_allocated_capacity + 1));
        }
        pcVar23 = local_330 + 1;
        local_330 = pcVar23;
      } while ((long)pcVar23 <
               (long)(int)((ulong)((long)local_358.
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_358.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
    iVar27 = (int)local_308;
    uVar13 = iVar27 + 1;
    local_308 = (ulong)uVar13;
    if (iVar27 != 0) {
      if (local_358.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_358.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Winding,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Winding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        uVar13 = extraout_EAX;
      }
      return uVar13;
    }
  } while( true );
}

Assistant:

void PrimitiveSetInvarianceCase::init (void)
{
	const int			numDifferentConstantExprCases = 2;
	vector<Winding>		windings;
	switch (m_windingUsage)
	{
		case WINDINGUSAGE_CCW:		windings.push_back(WINDING_CCW); break;
		case WINDINGUSAGE_CW:		windings.push_back(WINDING_CW); break;
		case WINDINGUSAGE_VARY:		windings.push_back(WINDING_CCW);
									windings.push_back(WINDING_CW); break;
		default: DE_ASSERT(false);
	}

	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	for (int constantExprCaseNdx = 0; constantExprCaseNdx < numDifferentConstantExprCases; constantExprCaseNdx++)
	{
		for (int windingCaseNdx = 0; windingCaseNdx < (int)windings.size(); windingCaseNdx++)
		{
			const string	floatLit01 = de::floatToString(10.0f / (float)(constantExprCaseNdx + 10), 2);
			const int		programNdx = (int)m_programs.size();

			std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "in highp float in_v_attr;\n"
															 "out highp float in_tc_attr;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_tc_attr = in_v_attr;\n"
														 "}\n");
			std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 "layout (vertices = " + de::toString(constantExprCaseNdx+1) + ") out;\n"
															 "\n"
															 "in highp float in_tc_attr[];\n"
															 "\n"
															 "patch out highp float in_te_positionOffset;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	in_te_positionOffset = in_tc_attr[6];\n"
															 "\n"
															 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
															 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
															 "\n"
															 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
															 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
															 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
															 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
														 "}\n");
			std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
															 "\n"
															 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, windings[windingCaseNdx], m_usePointMode) +
															 "\n"
															 "patch in highp float in_te_positionOffset;\n"
															 "\n"
															 "out highp vec4 in_f_color;\n"
															 "invariant out highp vec3 out_te_tessCoord;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	gl_Position = vec4(gl_TessCoord.xy*" + floatLit01 + " - in_te_positionOffset + float(gl_PrimitiveID)*0.1, 0.0, 1.0);\n"
															 "	in_f_color = vec4(" + floatLit01 + ");\n"
															 "	out_te_tessCoord = gl_TessCoord;\n"
														 "}\n");
			std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
															 "\n"
															 "layout (location = 0) out mediump vec4 o_color;\n"
															 "\n"
															 "in highp vec4 in_f_color;\n"
															 "\n"
															 "void main (void)\n"
															 "{\n"
															 "	o_color = in_f_color;\n"
														 "}\n");

			m_programs.push_back(Program(windings[windingCaseNdx],
										 SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
					<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
					<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
					<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
					<< glu::TransformFeedbackVarying		("out_te_tessCoord")
					<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)))));

			{
				const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program" + de::toString(programNdx), "Program " + de::toString(programNdx));

				if (programNdx == 0 || !m_programs.back().program->isOk())
					m_testCtx.getLog() << *m_programs.back().program;

				if (!m_programs.back().program->isOk())
					TCU_FAIL("Program compilation failed");

				if (programNdx > 0)
					m_testCtx.getLog() << TestLog::Message << "Note: program " << programNdx << " is similar to above, except some constants are different, and: " << m_programs.back().description() << TestLog::EndMessage;
			}
		}
	}
}